

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O1

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  pointer *pppTVar1;
  bool is64bits_00;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *this;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  byte *pbVar6;
  long *plVar7;
  Token *pTVar8;
  byte *pbVar9;
  undefined8 uVar10;
  iterator iVar11;
  Token **ppTVar12;
  int iVar13;
  undefined7 in_register_00000081;
  anon_union_8_2_0c989700_for_Token_4 aVar14;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  char *sb;
  char *se;
  undefined1 local_d8 [32];
  byte *local_b8;
  anon_union_8_2_0c989700_for_Token_4 local_b0;
  byte *local_a8;
  ulong local_a0;
  int local_94;
  uint64_t local_90;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_88;
  uint64_t local_80;
  anon_union_8_2_0c989700_for_Token_4 local_78;
  uint32_t local_6c;
  Token **local_68;
  undefined8 local_60;
  ulong local_58;
  byte *local_50;
  undefined8 local_48;
  byte local_40 [16];
  
  iVar13 = (int)CONCAT71(in_register_00000081,is64bits);
  if (iVar13 == 0) {
    uVar3 = ReadWord(input,cursor,end);
    uVar5 = (uint64_t)uVar3;
  }
  else {
    uVar5 = ReadDoubleWord(input,cursor,end);
  }
  local_a0 = uVar5;
  if (uVar5 != 0) {
    if ((ulong)((long)end - (long)input) < uVar5) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"block offset is out of range","");
      TokenizeError((string *)local_d8,(long)*cursor - (long)input);
    }
    if (uVar5 < (ulong)((long)*cursor - (long)input)) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"block offset is negative out of range","");
      TokenizeError((string *)local_d8,(long)*cursor - (long)input);
    }
    local_94 = iVar13;
    if (is64bits) {
      local_90 = ReadDoubleWord(input,cursor,end);
      local_80 = ReadDoubleWord(input,cursor,end);
    }
    else {
      uVar3 = ReadWord(input,cursor,end);
      local_90 = (uint64_t)uVar3;
      uVar3 = ReadWord(input,cursor,end);
      local_80 = (uint64_t)uVar3;
    }
    ReadString((char **)&local_a8,(char **)&local_b0,input,cursor,end,false,false);
    local_d8._0_8_ = operator_new(0x28);
    pcVar16 = *cursor;
    ((Token *)local_d8._0_8_)->sbegin = (char *)local_a8;
    ((Token *)local_d8._0_8_)->send = (char *)local_b0;
    ((Token *)local_d8._0_8_)->type = TokenType_KEY;
    (((Token *)local_d8._0_8_)->field_3).line = (long)pcVar16 - (long)input;
    ((Token *)local_d8._0_8_)->column = 0xffffffff;
    iVar11._M_current =
         (output_tokens->
         super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_88 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
               output_tokens;
    if (iVar11._M_current ==
        (output_tokens->
        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      _M_realloc_insert<Assimp::FBX::Token_const*>
                ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
                 output_tokens,iVar11,(Token **)local_d8);
    }
    else {
      *iVar11._M_current = (Token *)local_d8._0_8_;
      pppTVar1 = &(output_tokens->
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    iVar11._M_current = (Token **)*cursor;
    pbVar9 = local_a8;
    ppTVar12 = iVar11._M_current;
    aVar14 = local_b0;
    if (local_90 != 0) {
      local_b8 = (byte *)(local_80 + (long)iVar11._M_current);
      local_68 = iVar11._M_current;
      if ((byte *)*cursor != local_b8) {
        local_58 = local_90 - 1;
        uVar18 = 1;
        uVar19 = 0;
        pbVar9 = (byte *)*cursor;
        do {
          pbVar6 = local_b8;
          local_40[0] = *pbVar9;
          uVar10 = CONCAT71((int7)((ulong)iVar11._M_current >> 8),local_40[0]);
          *cursor = (char *)(pbVar9 + 1);
          local_a8 = pbVar9;
          local_b0 = aVar14;
          switch((uint)local_40[0]) {
          case 0x43:
            pbVar6 = pbVar9 + 2;
            goto LAB_0019979e;
          case 0x44:
          case 0x4c:
            pbVar6 = pbVar9 + 9;
            goto LAB_0019979e;
          case 0x45:
          case 0x47:
          case 0x48:
          case 0x4a:
          case 0x4b:
          case 0x4d:
          case 0x4e:
          case 0x4f:
          case 0x50:
          case 0x51:
switchD_0019965c_caseD_45:
            local_50 = local_40;
            local_48 = 1;
            local_40[1] = 0;
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f678b);
            local_d8._0_8_ = *plVar7;
            pTVar8 = (Token *)(plVar7 + 2);
            if ((Token *)local_d8._0_8_ == pTVar8) {
              local_d8._16_8_ = pTVar8->sbegin;
              local_d8._24_8_ = plVar7[3];
              local_d8._0_8_ = (Token *)(local_d8 + 0x10);
            }
            else {
              local_d8._16_8_ = pTVar8->sbegin;
            }
            local_d8._8_8_ = plVar7[1];
            *plVar7 = (long)pTVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            TokenizeError((string *)local_d8,(long)*cursor - (long)input);
          case 0x46:
          case 0x49:
            pbVar6 = pbVar9 + 5;
LAB_0019979e:
            *cursor = (char *)pbVar6;
            break;
          case 0x52:
            uVar3 = ReadWord(input,cursor,(char *)local_b8);
            *cursor = *cursor + uVar3;
            break;
          case 0x53:
            ReadString((char **)local_d8,(char **)&local_50,input,cursor,(char *)local_b8,true,true)
            ;
            break;
          default:
            uVar2 = local_40[0] - 0x59;
            if (0x13 < uVar2) goto switchD_0019965c_caseD_45;
            if ((0x92c00U >> (uVar2 & 0x1f) & 1) == 0) {
              if (uVar2 == 0) {
                pbVar6 = pbVar9 + 3;
              }
              else if (uVar2 != 9) goto switchD_0019965c_caseD_45;
              goto LAB_0019979e;
            }
            local_78 = aVar14;
            local_60 = uVar10;
            local_6c = ReadWord(input,cursor,(char *)local_b8);
            uVar3 = ReadWord(input,cursor,(char *)pbVar6);
            uVar4 = ReadWord(input,cursor,(char *)pbVar6);
            if (uVar3 != 1) {
              if (uVar3 != 0) {
                local_b0 = local_78;
                local_d8._0_8_ = local_d8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_d8,"cannot ReadData, unknown encoding","");
                TokenizeError((string *)local_d8,(long)*cursor - (long)input);
              }
              uVar2 = (int)local_60 - 99;
              iVar13 = 0;
              if ((byte)uVar2 < 10) {
                iVar13 = *(int *)(&DAT_001f64a4 + (ulong)(uVar2 & 0xff) * 4);
              }
              if (iVar13 * local_6c != uVar4) {
                local_b0 = local_78;
                local_d8._0_8_ = local_d8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_d8,
                           "cannot ReadData, calculated data stride differs from what the file claims"
                           ,"");
                TokenizeError((string *)local_d8,(long)*cursor - (long)input);
              }
            }
            *cursor = *cursor + uVar4;
            uVar10 = local_60;
            local_b0 = local_78;
          }
          aVar14 = (anon_union_8_2_0c989700_for_Token_4)*cursor;
          if (local_b8 < aVar14.line) {
            local_50 = local_40;
            local_40[0] = (byte)uVar10;
            local_48 = 1;
            local_40[1] = 0;
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1f67b3);
            local_d8._0_8_ = *plVar7;
            pTVar8 = (Token *)(plVar7 + 2);
            if ((Token *)local_d8._0_8_ == pTVar8) {
              local_d8._16_8_ = pTVar8->sbegin;
              local_d8._24_8_ = plVar7[3];
              local_d8._0_8_ = (Token *)(local_d8 + 0x10);
            }
            else {
              local_d8._16_8_ = pTVar8->sbegin;
            }
            local_d8._8_8_ = plVar7[1];
            *plVar7 = (long)pTVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            TokenizeError((string *)local_d8,(long)*cursor - (long)input);
          }
          local_d8._0_8_ = operator_new(0x28);
          this = local_88;
          ((Token *)local_d8._0_8_)->sbegin = (char *)pbVar9;
          ((Token *)local_d8._0_8_)->send = (char *)aVar14;
          ((Token *)local_d8._0_8_)->type = TokenType_DATA;
          (((Token *)local_d8._0_8_)->field_3).line = aVar14.line - (long)input;
          ((Token *)local_d8._0_8_)->column = 0xffffffff;
          iVar11._M_current = *(Token ***)(local_88 + 8);
          if (iVar11._M_current == *(Token ***)(local_88 + 0x10)) {
            std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
            _M_realloc_insert<Assimp::FBX::Token_const*>(local_88,iVar11,(Token **)local_d8);
          }
          else {
            *iVar11._M_current = (Token *)local_d8._0_8_;
            *(long *)(local_88 + 8) = *(long *)(local_88 + 8) + 8;
          }
          if (local_58 != uVar19) {
            local_d8._0_8_ = operator_new(0x28);
            pcVar16 = *cursor;
            ((Token *)local_d8._0_8_)->sbegin = pcVar16;
            ((Token *)local_d8._0_8_)->send = pcVar16 + 1;
            ((Token *)local_d8._0_8_)->type = TokenType_COMMA;
            (((Token *)local_d8._0_8_)->field_3).line = (long)pcVar16 - (long)input;
            ((Token *)local_d8._0_8_)->column = 0xffffffff;
            iVar11._M_current = *(Token ***)(this + 8);
            if (iVar11._M_current == *(Token ***)(this + 0x10)) {
              std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
              _M_realloc_insert<Assimp::FBX::Token_const*>(this,iVar11,(Token **)local_d8);
            }
            else {
              *iVar11._M_current = (Token *)local_d8._0_8_;
              *(long *)(this + 8) = *(long *)(this + 8) + 8;
            }
          }
          uVar19 = (ulong)uVar18;
          ppTVar12 = local_68;
          if (local_90 <= uVar19) goto LAB_001998f1;
          uVar18 = uVar18 + 1;
          pbVar9 = (byte *)*cursor;
          local_b0 = aVar14;
        } while ((byte *)*cursor != local_b8);
      }
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"cannot ReadData, out of bounds reading length","");
      TokenizeError((string *)local_d8,(long)*cursor - (long)input);
    }
LAB_001998f1:
    uVar19 = local_a0;
    pcVar16 = *cursor;
    local_a8 = pbVar9;
    local_b0 = aVar14;
    if ((long)pcVar16 - (long)ppTVar12 != local_80) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"property length not reached, something is wrong","");
      TokenizeError((string *)local_d8,(long)*cursor - (long)input);
    }
    lVar20 = -0xd;
    if ((char)local_94 != '\0') {
      lVar20 = -0x19;
    }
    pbVar9 = (byte *)0xd;
    if ((char)local_94 != '\0') {
      pbVar9 = (byte *)0x19;
    }
    uVar15 = (long)pcVar16 - (long)input;
    if (uVar15 < local_a0) {
      if ((byte *)(local_a0 - uVar15) < pbVar9) {
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"insufficient padding bytes at block end","");
        TokenizeError((string *)local_d8,(long)*cursor - (long)input);
      }
      local_d8._0_8_ = operator_new(0x28);
      ((Token *)local_d8._0_8_)->sbegin = pcVar16;
      ((Token *)local_d8._0_8_)->send = pcVar16 + 1;
      ((Token *)local_d8._0_8_)->type = TokenType_OPEN_BRACKET;
      (((Token *)local_d8._0_8_)->field_3).line = uVar15;
      ((Token *)local_d8._0_8_)->column = 0xffffffff;
      iVar11._M_current = *(Token ***)(local_88 + 8);
      if (iVar11._M_current == *(Token ***)(local_88 + 0x10)) {
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        _M_realloc_insert<Assimp::FBX::Token_const*>(local_88,iVar11,(Token **)local_d8);
      }
      else {
        *iVar11._M_current = (Token *)local_d8._0_8_;
        *(long *)(local_88 + 8) = *(long *)(local_88 + 8) + 8;
      }
      pcVar16 = *cursor;
      sVar17 = (long)pcVar16 - (long)input;
      local_b8 = pbVar9;
      if (sVar17 < uVar19 - (long)pbVar9) {
        lVar20 = lVar20 + local_a0;
        is64bits_00 = (bool)(char)local_94;
        do {
          ReadScope((TokenList *)local_88,input,cursor,input + lVar20,is64bits_00);
          pcVar16 = *cursor;
          sVar17 = (long)pcVar16 - (long)input;
        } while (sVar17 < uVar19 - (long)pbVar9);
      }
      local_d8._0_8_ = operator_new(0x28);
      ((Token *)local_d8._0_8_)->sbegin = pcVar16;
      ((Token *)local_d8._0_8_)->send = pcVar16 + 1;
      ((Token *)local_d8._0_8_)->type = TokenType_CLOSE_BRACKET;
      (((Token *)local_d8._0_8_)->field_3).line = sVar17;
      ((Token *)local_d8._0_8_)->column = 0xffffffff;
      iVar11._M_current = *(Token ***)(local_88 + 8);
      if (iVar11._M_current == *(Token ***)(local_88 + 0x10)) {
        std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
        _M_realloc_insert<Assimp::FBX::Token_const*>(local_88,iVar11,(Token **)local_d8);
      }
      else {
        *iVar11._M_current = (Token *)local_d8._0_8_;
        *(long *)(local_88 + 8) = *(long *)(local_88 + 8) + 8;
      }
      lVar20 = 0;
      do {
        if ((*cursor)[lVar20] != '\0') {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,
                     "failed to read nested block sentinel, expected all bytes to be 0","");
          TokenizeError((string *)local_d8,(long)*cursor - (long)input);
        }
        lVar20 = lVar20 + 1;
      } while ((uint)lVar20 < (uint)local_b8);
      *cursor = *cursor + (long)local_b8;
    }
    if ((long)*cursor - (long)input != local_a0) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"scope length not reached, something is wrong","");
      TokenizeError((string *)local_d8,(long)*cursor - (long)input);
    }
  }
  return local_a0 != 0;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}